

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_geometry_device.cpp
# Opt level: O0

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  float fVar6;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  TutorialData *in_RDI;
  int in_R8D;
  undefined8 *in_stack_00000008;
  int *in_stack_00000010;
  uint b;
  uint g;
  uint r;
  float d;
  float s;
  Vec3fa r_4;
  RTCOccludedArguments sargs;
  Ray shadow;
  Vec3fa lightDir;
  Vec3fa Ng;
  Vec3fa diffuse;
  Vec3fa color;
  RTCIntersectArguments iargs;
  Ray ray;
  __m128 c_2;
  __m128 r_2;
  __m128 a_2;
  __m128 c_1;
  __m128 r_1;
  __m128 a_1;
  __m128 c_4;
  __m128 r_3;
  __m128 a_4;
  __m128 c_6;
  __m128 r_5;
  __m128 a_6;
  vint4 mask_4;
  vint4 mask_3;
  vint4 mask_1;
  vint4 mask;
  __m128 mask_2;
  vfloat4 c_7;
  vfloat4 b_4;
  vfloat4 a_7;
  vfloat4 c_8;
  vfloat4 b_5;
  vfloat4 a_8;
  vfloat4 c_5;
  vfloat4 b_3;
  vfloat4 a_5;
  vfloat4 c_3;
  vfloat4 b_2;
  vfloat4 a_3;
  vfloat4 c;
  vfloat4 b_1;
  vfloat4 a;
  float local_2ca8;
  float local_2ca4;
  float local_2ca0;
  float local_2c9c;
  float local_2c98;
  float local_2c94;
  float local_2c90;
  float local_2c8c;
  float local_2c88;
  float local_2c84;
  float in_stack_ffffffffffffd3a0;
  TutorialData *data_00;
  undefined8 local_2c18;
  float fStack_2c10;
  undefined4 local_2bb8;
  undefined4 local_2bb4;
  float local_2bb0 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2ba8;
  embree local_2b98 [16];
  undefined8 local_2b88;
  undefined8 uStack_2b80;
  undefined4 local_2b78;
  undefined4 local_2b74;
  undefined8 local_2b70;
  undefined8 local_2b68;
  undefined8 local_2b60;
  undefined1 local_2b58 [8];
  ulong uStack_2b50;
  undefined8 local_2b48;
  undefined8 uStack_2b40;
  undefined8 local_2b38;
  ulong uStack_2b30;
  undefined8 local_2b28;
  ulong uStack_2b20;
  undefined8 local_2b18;
  ulong uStack_2b10;
  undefined1 local_2b08 [8];
  ulong uStack_2b00;
  float local_2af8;
  undefined4 local_2af4;
  undefined1 auStack_2ae8 [20];
  undefined4 local_2ad4;
  undefined4 local_2ad0;
  undefined4 local_2acc;
  undefined4 local_2ac8;
  undefined8 local_2ab8;
  undefined8 uStack_2ab0;
  float local_2aa8;
  float fStack_2aa4;
  float fStack_2aa0;
  float fStack_2a9c;
  undefined8 local_2a98;
  undefined8 uStack_2a90;
  float local_2a88;
  float fStack_2a84;
  ulong uStack_2a80;
  float local_2a74 [3];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2a68;
  undefined8 local_2a58;
  undefined8 uStack_2a50;
  undefined1 local_2a48 [16];
  undefined1 local_2a38 [16];
  embree local_2a28 [16];
  undefined8 local_2a18;
  undefined8 uStack_2a10;
  float local_2a08;
  float fStack_2a04;
  ulong uStack_2a00;
  undefined4 local_29f8;
  undefined4 local_29f4;
  undefined8 local_29f0;
  undefined8 local_29e8;
  undefined8 local_29e0;
  undefined8 local_29d8;
  ulong uStack_29d0;
  undefined8 local_29c8;
  ulong uStack_29c0;
  undefined8 local_29b8;
  undefined8 uStack_29b0;
  undefined8 local_29a8;
  ulong uStack_29a0;
  undefined8 local_2998;
  undefined8 uStack_2990;
  undefined8 local_2988;
  undefined8 uStack_2980;
  undefined8 local_2978;
  undefined8 uStack_2970;
  Vec3fa *local_2968;
  ulong uStack_2960;
  undefined1 local_2958 [52];
  undefined4 local_2924;
  float local_2918;
  float local_2914;
  float local_2910;
  float local_290c;
  uint local_2904;
  uint local_2900;
  undefined4 local_28fc;
  undefined4 local_28f8;
  int local_28dc;
  long local_28d8;
  int local_28d0;
  int local_28cc;
  TutorialData *local_28c8;
  undefined8 *local_2890;
  float *local_2888;
  float *local_2880;
  undefined8 *local_2878;
  undefined8 *local_2870;
  undefined8 *local_2868;
  undefined8 *local_2860;
  undefined8 *local_2858;
  undefined8 *local_2850;
  undefined8 local_2818;
  undefined8 uStack_2810;
  undefined4 local_27fc;
  undefined8 *local_27f8;
  undefined8 *local_27f0;
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  undefined8 *local_27a0;
  undefined4 local_2794;
  undefined8 *local_2790;
  undefined8 local_2788;
  undefined8 uStack_2780;
  undefined8 *local_2770;
  float local_2764;
  undefined8 *local_2760;
  undefined8 local_2758;
  undefined8 uStack_2750;
  undefined8 *local_2740;
  float local_2734;
  undefined8 *local_2730;
  undefined8 *local_2728;
  TutorialData *local_2720;
  undefined8 *local_2710;
  undefined8 *local_2708;
  undefined8 *local_2700;
  undefined8 *local_26f8;
  undefined8 *local_26f0;
  float *local_26e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_26e0;
  embree *local_26d8;
  undefined8 *local_26d0;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  float local_26ac;
  embree *local_26a8;
  undefined8 *local_26a0;
  undefined8 *local_2698;
  float *local_2690;
  undefined8 local_2688;
  undefined8 uStack_2680;
  float local_266c;
  undefined8 *local_2668;
  float *local_2660;
  undefined8 *local_2658;
  Vec3fa **local_2650;
  undefined8 local_2648;
  undefined8 uStack_2640;
  float local_2634;
  undefined8 *local_2630;
  Vec3fa **local_2628;
  undefined1 *local_2620;
  undefined1 *local_2618;
  undefined4 local_2610;
  undefined4 local_260c;
  undefined4 local_2608;
  undefined4 local_2604;
  float local_2600;
  undefined4 local_25fc;
  Vec3fa **local_25f8;
  TutorialData *local_25f0;
  undefined1 *local_25e8;
  undefined4 local_25e0;
  undefined4 local_25dc;
  undefined4 local_25d8;
  undefined4 local_25d4;
  float local_25d0;
  undefined4 local_25cc;
  undefined1 *local_25c8;
  undefined8 *local_25c0;
  undefined8 *local_25b8;
  undefined4 *local_25b0;
  undefined1 *local_25a8;
  int *local_25a0;
  float local_2594;
  undefined8 *local_2590;
  float local_2584;
  undefined8 *local_2580;
  float local_2574;
  undefined8 *local_2570;
  float local_2564;
  undefined8 *local_2560;
  float local_2554;
  undefined8 *local_2550;
  undefined4 local_2544;
  undefined8 *local_2540;
  undefined4 local_2524;
  undefined8 *local_2520;
  undefined4 local_2504;
  float *local_2500;
  undefined4 local_24e4;
  undefined4 local_24e0;
  undefined4 local_24dc;
  undefined8 *local_24d8;
  undefined4 local_24cc;
  undefined4 local_24c8;
  undefined4 local_24c4;
  undefined8 *local_24c0;
  float *local_24a8;
  float *local_24a0;
  undefined8 *local_2498;
  undefined8 *local_2490;
  undefined1 *local_2488;
  undefined8 *local_2480;
  undefined1 *local_2478;
  undefined8 *local_2470;
  embree *local_2468;
  undefined8 *local_2460;
  float local_2454;
  float *local_2450;
  float *local_2448;
  undefined8 *local_2440;
  undefined1 *local_2438;
  undefined8 *local_2430;
  undefined1 local_2428 [16];
  undefined1 *local_2418;
  float local_240c;
  undefined8 *local_2408;
  undefined1 *local_2400;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_23f8;
  undefined8 *local_23f0;
  undefined8 *local_23e8;
  float *local_23e0;
  undefined1 *local_23d8;
  undefined4 *local_23d0;
  undefined8 *local_23c8;
  int *local_23c0;
  undefined4 local_23b8;
  float local_23b4;
  undefined4 *local_2350;
  undefined4 *local_2348;
  float *local_2340;
  undefined8 local_2338;
  undefined8 uStack_2330;
  undefined8 *local_2328;
  undefined8 *local_2320;
  undefined8 local_2318;
  undefined8 uStack_2310;
  undefined8 *local_2308;
  undefined8 *local_2300;
  undefined8 local_22f8;
  undefined8 uStack_22f0;
  embree *local_22e8;
  embree *local_22e0;
  undefined8 local_22b8;
  undefined8 uStack_22b0;
  float *local_22a8;
  undefined8 *local_22a0;
  undefined8 local_2298;
  undefined8 uStack_2290;
  undefined8 local_2288;
  undefined8 uStack_2280;
  undefined8 local_2278;
  undefined8 uStack_2270;
  undefined8 local_2268;
  undefined8 uStack_2260;
  undefined8 local_2258;
  ulong uStack_2250;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_2238;
  undefined8 uStack_2230;
  float local_2228;
  float fStack_2224;
  undefined8 uStack_2220;
  float fStack_2200;
  undefined8 local_21d8;
  ulong uStack_21d0;
  undefined8 *local_21c0;
  Vec3fa *local_21b8;
  int *piStack_21b0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_21a0;
  float local_2198;
  float fStack_2194;
  float fStack_2190;
  float fStack_218c;
  undefined8 *local_2180;
  float local_2178;
  float fStack_2174;
  float fStack_2170;
  float fStack_216c;
  undefined8 *local_2160;
  float local_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  float *local_2140;
  float *local_2100;
  undefined8 *local_20f8;
  undefined8 *local_20f0;
  float local_20e8;
  float fStack_20e4;
  float fStack_20e0;
  float fStack_20dc;
  undefined8 *local_20d8;
  embree *local_20a0;
  embree *local_2098;
  undefined8 *local_2090;
  float local_2088;
  float fStack_2084;
  float fStack_2080;
  float fStack_207c;
  undefined8 *local_2078;
  undefined8 *local_2070;
  undefined8 *local_2068;
  undefined8 *local_2060;
  undefined4 local_2058;
  undefined4 uStack_2054;
  undefined4 uStack_2050;
  undefined4 uStack_204c;
  undefined8 *local_2048;
  undefined8 *local_2040;
  undefined8 *local_2038;
  undefined8 *local_2030;
  float local_2028;
  float fStack_2024;
  float fStack_2020;
  float fStack_201c;
  undefined8 *local_2018;
  undefined8 *local_2010;
  undefined8 *local_2008;
  Vec3fa **local_2000;
  float local_1ff8;
  float fStack_1ff4;
  float fStack_1ff0;
  float fStack_1fec;
  Vec3fa **local_1fe8;
  undefined8 *local_1fe0;
  undefined8 *local_1fd8;
  float *local_1fd0;
  float local_1fc8;
  float fStack_1fc4;
  float fStack_1fc0;
  float fStack_1fbc;
  float *local_1fb8;
  undefined8 *local_1fb0;
  embree *local_1fa8;
  undefined8 *local_1fa0;
  float local_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  undefined8 *local_1f88;
  undefined8 *local_1f80;
  undefined8 *local_1f78;
  undefined8 *local_1f70;
  float local_1f68;
  float fStack_1f64;
  float fStack_1f60;
  float fStack_1f5c;
  undefined8 *local_1f58;
  undefined8 *local_1f50;
  undefined8 *local_1f48;
  undefined8 *local_1f40;
  float local_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  undefined8 *local_1f28;
  undefined8 *local_1f20;
  undefined8 *local_1f18;
  undefined8 *local_1f10;
  float local_1f08;
  float fStack_1f04;
  float fStack_1f00;
  float fStack_1efc;
  undefined8 *local_1ef8;
  undefined8 *local_1ec0;
  undefined8 *local_1eb8;
  undefined8 *local_1eb0;
  float local_1ea8;
  float fStack_1ea4;
  float fStack_1ea0;
  float fStack_1e9c;
  undefined8 *local_1e98;
  float local_1e48;
  float fStack_1e44;
  float fStack_1e40;
  undefined8 local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  float local_1e18;
  float fStack_1e14;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  float local_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  float local_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  float local_1ce8;
  float fStack_1ce4;
  float fStack_1ce0;
  float fStack_1cdc;
  float fStack_1cd0;
  float local_1cb8;
  float fStack_1cb4;
  float fStack_1cb0;
  float fStack_1cac;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined4 local_1c88;
  undefined4 local_1c84;
  undefined4 local_1c80;
  undefined4 local_1c7c;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  undefined4 local_1c68;
  undefined4 local_1c64;
  undefined4 local_1c60;
  undefined4 local_1c5c;
  float local_1c58;
  ulong uStack_1c50;
  float local_1c48;
  undefined4 local_1c3c;
  undefined8 local_1c38;
  ulong uStack_1c30;
  undefined4 local_1c28;
  undefined4 local_1c24;
  float local_1c20;
  undefined4 local_1c1c;
  undefined8 local_1c18;
  ulong uStack_1c10;
  undefined4 local_1c08;
  undefined4 local_1c04;
  uint local_1c00;
  undefined4 local_1bfc;
  undefined8 local_1bf8;
  ulong uStack_1bf0;
  undefined4 local_1be8;
  undefined4 local_1be4;
  uint local_1be0;
  undefined4 local_1bdc;
  RTCScene local_1bd8;
  RTCTraversable pRStack_1bd0;
  undefined4 local_1bc8;
  undefined4 local_1bc4;
  uint local_1bc0;
  undefined4 local_1bbc;
  ulong local_1bb8;
  undefined8 uStack_1bb0;
  undefined1 local_1ba8 [16];
  ulong local_1b98;
  undefined8 uStack_1b90;
  float local_1b7c;
  ulong local_1b78;
  undefined8 uStack_1b70;
  undefined1 local_1b68 [16];
  ulong local_1b58;
  undefined8 uStack_1b50;
  float local_1b3c;
  ulong local_1b38;
  undefined8 uStack_1b30;
  undefined1 local_1b28 [16];
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined4 local_1afc;
  ulong local_1af8;
  undefined8 uStack_1af0;
  undefined1 local_1ae8 [16];
  ulong local_1ad8;
  undefined8 uStack_1ad0;
  float local_1abc;
  undefined1 local_1ab8 [16];
  undefined4 local_1a9c;
  undefined1 local_1a98 [16];
  undefined4 local_1a7c;
  undefined1 local_1a78 [16];
  float local_1a5c;
  undefined1 local_1a58 [16];
  undefined4 local_1a3c;
  undefined1 local_1a38 [16];
  undefined4 local_1a1c;
  undefined1 local_1a18 [16];
  undefined4 local_19fc;
  undefined1 local_19f8 [16];
  undefined4 local_19dc;
  undefined1 local_19d8 [16];
  undefined4 local_19bc;
  undefined1 local_19b8 [16];
  float local_199c;
  undefined1 local_1998 [16];
  undefined4 local_197c;
  undefined1 local_1978 [16];
  undefined4 local_195c;
  undefined1 local_1958 [16];
  float local_193c;
  ulong local_1938;
  undefined8 uStack_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  ulong local_1918;
  undefined8 uStack_1910;
  ulong local_1908;
  undefined8 uStack_1900;
  ulong local_18f8;
  undefined8 uStack_18f0;
  ulong local_18e8;
  undefined8 uStack_18e0;
  ulong local_18d8;
  undefined8 uStack_18d0;
  ulong local_18c8;
  undefined8 uStack_18c0;
  ulong local_18b8;
  undefined8 uStack_18b0;
  ulong local_18a8;
  undefined8 uStack_18a0;
  ulong local_1898;
  undefined8 uStack_1890;
  ulong local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  ulong local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  ulong local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  ulong local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  ulong local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  ulong local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  ulong local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  ulong local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  ulong local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  ulong local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  ulong local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  ulong local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  ulong local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  ulong local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  ulong local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  ulong local_1608;
  undefined8 uStack_1600;
  ulong local_15f8;
  undefined8 uStack_15f0;
  ulong local_15e8;
  undefined8 uStack_15e0;
  ulong local_15d8;
  undefined8 uStack_15d0;
  ulong local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined1 local_15a8 [16];
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined1 local_1588 [8];
  ulong uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined4 local_155c;
  undefined1 *local_1558;
  undefined1 *local_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  ulong uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  ulong uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined4 local_14ec;
  undefined8 *local_14e8;
  undefined8 *local_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  Vec3fa *local_14c8;
  ulong uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  Vec3fa *local_14a8;
  int *piStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined4 local_147c;
  Vec3fa **local_1478;
  undefined1 *local_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  RTCScene local_1458;
  RTCTraversable pRStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  RTCScene local_1438;
  Vec3fa *pVStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined4 local_140c;
  TutorialData *local_1408;
  undefined1 *local_1400;
  undefined1 *local_13f8;
  float *local_13f0;
  undefined4 local_13e8;
  undefined4 local_13e4;
  undefined4 local_13e0;
  undefined4 local_13dc;
  undefined8 *local_13d8;
  undefined4 local_13d0;
  undefined4 local_13cc;
  undefined4 local_13c8;
  undefined4 local_13c4;
  undefined8 *local_13c0;
  undefined4 local_13b8;
  undefined4 local_13b4;
  undefined4 local_13b0;
  undefined4 local_13ac;
  undefined8 *local_13a8;
  undefined4 local_13a0;
  undefined4 local_139c;
  undefined4 local_1398;
  undefined4 local_1394;
  undefined8 *local_1390;
  undefined8 *local_1388;
  RTCScene *local_1380;
  undefined8 *local_1378;
  RTCScene *local_1370;
  undefined8 *local_1368;
  Vec3fa **local_1360;
  undefined8 *local_1358;
  Vec3fa **local_1350;
  undefined8 *local_1348;
  undefined8 *local_1340;
  undefined8 *local_1338;
  undefined8 *local_1330;
  undefined8 *local_1328;
  undefined1 *local_1320;
  undefined8 *local_1318;
  undefined1 *local_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 *local_12c8;
  undefined8 *local_12c0;
  undefined8 *local_12b8;
  undefined8 *local_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 *local_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 *local_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 *local_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 *local_1230;
  ulong uStack_1220;
  undefined1 *local_1210;
  undefined8 local_1208;
  ulong uStack_1200;
  undefined8 *local_11f0;
  Vec3fa *local_11e8;
  int *piStack_11e0;
  Vec3fa **local_11d0;
  RTCScene local_11c8;
  Vec3fa *pVStack_11c0;
  RTCScene *local_11b0;
  RTCScene local_11a8;
  RTCTraversable pRStack_11a0;
  RTCScene *local_1190;
  Vec3fa *local_1188;
  ulong uStack_1180;
  Vec3fa **local_1170;
  undefined8 local_1168;
  ulong uStack_1160;
  undefined8 *local_1150;
  undefined1 *local_1130;
  undefined4 local_1124;
  undefined8 *local_1120;
  undefined4 local_1114;
  undefined8 *local_1110;
  undefined4 local_1104;
  undefined8 *local_1100;
  undefined4 local_10f4;
  undefined8 *local_10f0;
  RTCScene *local_10e8;
  Vec3fa **local_10e0;
  undefined8 *local_10d8;
  undefined1 *local_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined4 local_10b8;
  undefined4 local_10b4;
  undefined4 local_10b0;
  undefined4 local_10ac;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined4 local_1098;
  undefined4 local_1094;
  undefined4 local_1090;
  undefined4 local_108c;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined4 local_1078;
  undefined4 local_1074;
  undefined4 local_1070;
  undefined4 local_106c;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined4 local_1058;
  undefined4 local_1054;
  undefined4 local_1050;
  undefined4 local_104c;
  undefined4 local_1048;
  undefined4 uStack_1044;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  ulong uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  ulong uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  Vec3fa *local_ff8;
  int *piStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  RTCScene local_fd8;
  Vec3fa *pVStack_fd0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  ulong uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  Vec3fa *local_f88;
  ulong uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  RTCScene local_f68;
  RTCTraversable pRStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 *local_f48;
  undefined8 *local_f40;
  undefined8 *local_f38;
  undefined8 *local_f30;
  undefined8 *local_f28;
  undefined8 *local_f20;
  undefined8 *local_f18;
  undefined8 *local_f10;
  undefined8 *local_f08;
  undefined1 *local_f00;
  undefined8 *local_ef8;
  undefined8 *local_ef0;
  undefined8 *local_ee8;
  Vec3fa **local_ee0;
  undefined8 *local_ed8;
  RTCScene *local_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined4 local_e48;
  undefined4 uStack_e44;
  undefined4 uStack_e40;
  undefined4 uStack_e3c;
  undefined4 local_e2c;
  undefined4 local_e28;
  undefined4 uStack_e24;
  undefined4 uStack_e20;
  undefined4 uStack_e1c;
  undefined4 local_e0c;
  undefined4 local_e08;
  undefined4 uStack_e04;
  undefined4 uStack_e00;
  undefined4 uStack_dfc;
  undefined4 local_dec;
  undefined4 local_de8;
  undefined4 uStack_de4;
  undefined4 uStack_de0;
  undefined4 uStack_ddc;
  undefined4 local_dcc;
  undefined4 local_da8;
  undefined4 uStack_da4;
  undefined4 uStack_da0;
  undefined4 uStack_d9c;
  undefined4 local_d98;
  undefined4 local_d68;
  undefined4 uStack_d64;
  undefined4 uStack_d60;
  undefined4 uStack_d5c;
  undefined4 local_d4c;
  undefined4 local_d28;
  undefined4 uStack_d24;
  undefined4 uStack_d20;
  undefined4 uStack_d1c;
  undefined4 local_d18;
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  float local_cec;
  float local_ce8;
  float fStack_ce4;
  float fStack_ce0;
  float fStack_cdc;
  float local_ccc;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_cbc;
  float local_cac;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  float local_c8c;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  float local_c6c;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  undefined8 *local_c58;
  undefined1 *local_c50;
  undefined1 *local_c48;
  undefined8 *local_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  undefined8 *local_c00;
  float local_bf4;
  undefined1 *local_bf0;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_bcc;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  float *local_bb8;
  undefined1 *local_bb0;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  undefined1 *local_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined4 local_b6c;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined4 local_b58;
  undefined4 local_b54;
  undefined4 local_b50;
  undefined4 local_b4c;
  undefined8 local_b48;
  undefined8 uStack_b40;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 *local_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 *local_aa8;
  undefined8 *local_aa0;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 *local_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 *local_988;
  undefined8 *local_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 *local_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 *local_8f8;
  undefined8 *local_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 *local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  undefined8 *local_848;
  undefined8 *local_840;
  undefined8 *local_838;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_810;
  undefined8 *local_808;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 *local_7d8;
  undefined8 *local_7c0;
  undefined8 *local_7b8;
  undefined8 *local_7b0;
  undefined8 *local_7a8;
  undefined8 *local_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined4 local_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined8 *local_648;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_368;
  undefined8 *local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_258;
  undefined8 *local_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_138;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_118;
  undefined8 *local_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c4;
  float local_c0;
  float local_9c;
  float local_98;
  float local_74;
  float local_70;
  float local_6c;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  float local_18;
  float local_c;
  
  local_2728 = (undefined8 *)((long)in_stack_00000008 + 0x24);
  data_00 = (TutorialData *)local_2958;
  local_1bc0 = *(uint *)((long)in_stack_00000008 + 0x2c);
  local_1bc8 = *(undefined4 *)local_2728;
  local_1bc4 = *(undefined4 *)(in_stack_00000008 + 5);
  local_1bd8 = (RTCScene)*local_2728;
  local_1bbc = 0;
  pRStack_1bd0 = (RTCTraversable)(ulong)local_1bc0;
  local_2734 = (float)in_ESI;
  local_2740 = &local_29a8;
  local_1be0 = *(uint *)(in_stack_00000008 + 1);
  local_1be8 = *(undefined4 *)in_stack_00000008;
  local_1be4 = *(undefined4 *)((long)in_stack_00000008 + 4);
  local_1bf8 = *in_stack_00000008;
  local_1bdc = 0;
  uStack_1bf0 = (ulong)local_1be0;
  local_2858 = &local_2998;
  local_2560 = &local_2758;
  local_1da8 = CONCAT44(local_2734,local_2734);
  uStack_1da0 = CONCAT44(local_2734,local_2734);
  local_1db8 = (float)local_29a8;
  fStack_1db4 = (float)((ulong)local_29a8 >> 0x20);
  fStack_1db0 = (float)uStack_29a0;
  fStack_1dac = (float)(uStack_29a0 >> 0x20);
  local_1f68 = local_2734 * local_1db8;
  fStack_1f64 = local_2734 * fStack_1db4;
  fStack_1f60 = local_2734 * fStack_1db0;
  fStack_1f5c = local_2734 * fStack_1dac;
  local_2268 = CONCAT44(fStack_1f64,local_1f68);
  uStack_2260 = CONCAT44(fStack_1f5c,fStack_1f60);
  local_2764 = (float)in_EDX;
  local_2708 = (undefined8 *)((long)in_stack_00000008 + 0xc);
  local_2770 = &local_29c8;
  local_1c00 = *(uint *)((long)in_stack_00000008 + 0x14);
  local_1c08 = *(undefined4 *)local_2708;
  local_1c04 = *(undefined4 *)(in_stack_00000008 + 2);
  local_1c18 = *local_2708;
  local_1bfc = 0;
  uStack_1c10 = (ulong)local_1c00;
  local_2860 = &local_29b8;
  local_2550 = &local_2788;
  local_1dc8 = CONCAT44(local_2764,local_2764);
  uStack_1dc0 = CONCAT44(local_2764,local_2764);
  local_1dd8 = (float)local_29c8;
  fStack_1dd4 = (float)((ulong)local_29c8 >> 0x20);
  fStack_1dd0 = (float)uStack_29c0;
  fStack_1dcc = (float)(uStack_29c0 >> 0x20);
  local_1f38 = local_2764 * local_1dd8;
  fStack_1f34 = local_2764 * fStack_1dd4;
  fStack_1f30 = local_2764 * fStack_1dd0;
  fStack_1f2c = local_2764 * fStack_1dcc;
  local_2278 = CONCAT44(fStack_1f34,local_1f38);
  uStack_2270 = CONCAT44(fStack_1f2c,fStack_1f30);
  local_2870 = &local_2988;
  local_2198 = local_1f68 + local_1f38;
  fStack_2194 = fStack_1f64 + fStack_1f34;
  fStack_2190 = fStack_1f60 + fStack_1f30;
  fStack_218c = fStack_1f5c + fStack_1f2c;
  local_2248 = CONCAT44(fStack_2194,local_2198);
  uStack_2240 = CONCAT44(fStack_218c,fStack_2190);
  local_26f8 = in_stack_00000008 + 3;
  local_2878 = &local_29d8;
  local_1c20 = *(float *)(in_stack_00000008 + 4);
  local_1c28 = *(undefined4 *)local_26f8;
  local_1c24 = *(undefined4 *)((long)in_stack_00000008 + 0x1c);
  local_1c38 = *local_26f8;
  local_1c1c = 0;
  uStack_2250 = (ulong)(uint)local_1c20;
  local_2868 = &local_2978;
  local_2258._0_4_ = (float)local_1c38;
  local_2258._4_4_ = (float)((ulong)local_1c38 >> 0x20);
  local_2178 = local_2198 + (float)local_2258;
  fStack_2174 = fStack_2194 + local_2258._4_4_;
  fStack_2170 = fStack_2190 + local_1c20;
  fStack_216c = fStack_218c + 0.0;
  local_1d48 = CONCAT44(fStack_2174,local_2178);
  uStack_1d40 = CONCAT44(fStack_216c,fStack_2170);
  local_2030 = &local_2338;
  local_2028 = local_2178 * local_2178;
  fStack_2024 = fStack_2174 * fStack_2174;
  fStack_2020 = fStack_2170 * fStack_2170;
  fStack_201c = fStack_216c * fStack_216c;
  local_878 = CONCAT44(fStack_2024,local_2028);
  uStack_870 = CONCAT44(fStack_201c,fStack_2020);
  local_860 = &local_8a8;
  local_848 = &local_8b8;
  local_738 = CONCAT44(fStack_2024,fStack_2024);
  uStack_730 = CONCAT44(fStack_2024,fStack_2024);
  local_7f8 = &local_8c8;
  local_798 = CONCAT44(fStack_2020,fStack_2020);
  uStack_790 = CONCAT44(fStack_2020,fStack_2020);
  local_7a8 = &local_8e8;
  local_718 = local_2028 + fStack_2024;
  fStack_714 = fStack_2024 + fStack_2024;
  fStack_710 = fStack_2020 + fStack_2024;
  fStack_70c = fStack_201c + fStack_2024;
  local_788 = CONCAT44(fStack_714,local_718);
  uStack_780 = CONCAT44(fStack_70c,fStack_710);
  local_858 = &local_8d8;
  local_1b3c = local_718 + fStack_2020;
  fStack_774 = fStack_714 + fStack_2020;
  fStack_770 = fStack_710 + fStack_2020;
  fStack_76c = fStack_70c + fStack_2020;
  local_888 = CONCAT44(fStack_774,local_1b3c);
  uStack_880 = CONCAT44(fStack_76c,fStack_770);
  local_19b8 = ZEXT416((uint)local_1b3c);
  local_1b58 = CONCAT44(0,local_1b3c);
  uStack_1b50 = 0;
  uStack_1910 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_1b58;
  local_1b68 = rsqrtss(auVar2,auVar2);
  local_19bc = 0x3fc00000;
  local_19d8 = ZEXT416(0x3fc00000);
  local_16b8 = local_1b68._0_8_;
  uVar4 = local_16b8;
  uStack_16b0 = local_1b68._8_8_;
  local_16b8._0_4_ = local_1b68._0_4_;
  local_16a8 = (ulong)(uint)((float)local_16b8 * 1.5);
  uStack_16a0 = 0;
  local_19dc = 0xbf000000;
  local_19f8 = ZEXT416(0xbf000000);
  local_16d8 = local_19f8._0_8_;
  uStack_16d0 = 0;
  local_16c8 = (ulong)(uint)(local_1b3c * -0.5);
  uStack_16c0 = 0;
  local_16f8 = local_1b68._0_8_;
  uStack_16f0 = local_1b68._8_8_;
  local_2634 = local_1b3c * -0.5 * (float)local_16b8;
  local_16e8 = (ulong)(uint)local_2634;
  uStack_16e0 = 0;
  local_1718 = local_1b68._0_8_;
  uStack_1710 = local_1b68._8_8_;
  local_1708 = CONCAT44(local_1b68._4_4_,(float)local_16b8 * (float)local_16b8);
  uStack_1700 = local_1b68._8_8_;
  local_1738 = local_1708;
  uStack_1730 = local_1b68._8_8_;
  local_2634 = local_2634 * (float)local_16b8 * (float)local_16b8;
  local_1728 = (ulong)(uint)local_2634;
  uStack_1720 = 0;
  local_18b8 = local_1728;
  uStack_18b0 = 0;
  local_2634 = (float)local_16b8 * 1.5 + local_2634;
  local_18a8 = (ulong)(uint)local_2634;
  uStack_18a0 = 0;
  local_1b78 = local_18a8;
  uStack_1b70 = 0;
  local_15d8 = local_18a8;
  uStack_15d0 = 0;
  local_2590 = &local_2648;
  local_1d58 = CONCAT44(local_2634,local_2634);
  uStack_1d50 = CONCAT44(local_2634,local_2634);
  local_1ff8 = local_2178 * local_2634;
  fStack_1ff4 = fStack_2174 * local_2634;
  fStack_1ff0 = fStack_2170 * local_2634;
  fStack_1fec = fStack_216c * local_2634;
  local_2968 = (Vec3fa *)CONCAT44(fStack_1ff4,local_1ff8);
  uStack_2960 = CONCAT44(fStack_1fec,fStack_1ff0);
  local_2618 = &inf;
  local_28dc = in_R8D;
  local_28d8 = in_RCX;
  local_28d0 = in_EDX;
  local_28cc = in_ESI;
  local_28c8 = in_RDI;
  local_2850 = local_2870;
  local_2760 = local_2860;
  local_2730 = local_2858;
  local_2720 = data_00;
  local_2710 = local_2740;
  local_2700 = local_2770;
  local_26f0 = local_2878;
  local_2658 = local_2868;
  local_2650 = &local_2968;
  local_2630 = local_2868;
  local_2628 = &local_2968;
  local_2594 = local_2634;
  local_2564 = local_2734;
  local_2554 = local_2764;
  local_2328 = local_2868;
  local_2320 = local_2868;
  local_2258 = local_1c38;
  local_2180 = local_2870;
  local_2160 = local_2868;
  local_2040 = local_2868;
  local_2038 = local_2868;
  local_2018 = local_2030;
  local_2010 = local_2590;
  local_2008 = local_2868;
  local_2000 = &local_2968;
  local_1fe8 = &local_2968;
  local_1f80 = local_2740;
  local_1f78 = local_2560;
  local_1f70 = local_2858;
  local_1f58 = local_2858;
  local_1f50 = local_2770;
  local_1f48 = local_2550;
  local_1f40 = local_2860;
  local_1f28 = local_2860;
  local_1d38 = local_1d48;
  uStack_1d30 = uStack_1d40;
  local_1d28 = local_1d48;
  uStack_1d20 = uStack_1d40;
  uStack_1c30 = uStack_2250;
  local_199c = local_1b3c;
  local_1918 = local_1b58;
  local_16b8 = uVar4;
  local_d08 = local_2764;
  fStack_d04 = local_2764;
  fStack_d00 = local_2764;
  fStack_cfc = local_2764;
  local_cec = local_2764;
  local_ce8 = local_2734;
  fStack_ce4 = local_2734;
  fStack_ce0 = local_2734;
  fStack_cdc = local_2734;
  local_ccc = local_2734;
  local_c88 = local_2634;
  fStack_c84 = local_2634;
  fStack_c80 = local_2634;
  fStack_c7c = local_2634;
  local_c6c = local_2634;
  local_890 = local_2030;
  local_850 = local_860;
  local_800 = local_860;
  local_7b0 = local_7f8;
  local_7a0 = local_858;
  local_778 = local_1b3c;
  local_768 = local_858;
  local_760 = local_7f8;
  local_758 = local_7a8;
  local_750 = local_848;
  local_748 = local_860;
  local_740 = local_7a8;
  local_728 = local_878;
  uStack_720 = uStack_870;
  local_708 = local_7a8;
  local_700 = local_848;
  local_6f8 = local_860;
  local_2e8 = local_860;
  local_2e0 = local_848;
  local_2d8 = fStack_2024;
  fStack_2d4 = fStack_2024;
  fStack_2d0 = fStack_2024;
  fStack_2cc = fStack_2024;
  local_2c8 = local_738;
  uStack_2c0 = uStack_730;
  local_2b8 = local_848;
  local_2b0 = local_860;
  local_2a8 = local_878;
  uStack_2a0 = uStack_870;
  local_118 = local_860;
  local_110 = local_7f8;
  local_108 = fStack_2020;
  fStack_104 = fStack_2020;
  fStack_100 = fStack_2020;
  fStack_fc = fStack_2020;
  local_f8 = local_798;
  uStack_f0 = uStack_790;
  local_e8 = local_7f8;
  local_e0 = local_860;
  local_d8 = local_878;
  uStack_d0 = uStack_870;
  local_29d8 = local_1c38;
  uStack_29d0 = uStack_2250;
  local_29c8 = local_1c18;
  uStack_29c0 = uStack_1c10;
  local_29b8 = local_2278;
  uStack_29b0 = uStack_2270;
  local_29a8 = local_1bf8;
  uStack_29a0 = uStack_1bf0;
  local_2998 = local_2268;
  uStack_2990 = uStack_2260;
  local_2988 = local_2248;
  uStack_2980 = uStack_2240;
  local_2978 = local_1d48;
  uStack_2970 = uStack_1d40;
  local_2958._0_8_ = local_1bd8;
  local_2958._8_8_ = pRStack_1bd0;
  local_2788 = local_1dc8;
  uStack_2780 = uStack_1dc0;
  local_2758 = local_1da8;
  uStack_2750 = uStack_1da0;
  local_2648 = local_1d58;
  uStack_2640 = uStack_1d50;
  local_2338 = local_878;
  uStack_2330 = uStack_870;
  local_8e8 = local_788;
  uStack_8e0 = uStack_780;
  local_8d8 = local_888;
  uStack_8d0 = uStack_880;
  local_8c8 = local_798;
  uStack_8c0 = uStack_790;
  local_8b8 = local_738;
  uStack_8b0 = uStack_730;
  local_8a8 = local_878;
  uStack_8a0 = uStack_870;
  local_2958._48_4_ = std::numeric_limits<float>::infinity();
  local_25e8 = local_2958 + 0x10;
  local_25fc = 0;
  local_2604 = 0;
  local_2608 = 0xffffffff;
  local_260c = 0xffffffff;
  local_2610 = 0xffffffff;
  local_140c = 0;
  local_13d8 = &local_1428;
  local_13dc = 0xffffffff;
  local_13e0 = 0xffffffff;
  local_13e4 = 0xffffffff;
  local_13e8 = 0;
  local_104c = 0;
  local_1050 = 0xffffffff;
  local_1054 = 0xffffffff;
  local_1058 = 0xffffffff;
  local_1068 = 0xffffffffffffffff;
  uStack_1060 = 0xffffffff;
  local_1428 = 0xffffffffffffffff;
  uStack_1420 = 0xffffffff;
  local_1308 = 0xffffffffffffffff;
  uStack_1300 = 0xffffffff;
  local_1378 = &local_1448;
  local_1448 = 0xffffffffffffffff;
  uStack_1440 = 0xffffffff;
  local_11c8 = data_00->g_scene;
  pRStack_11a0 = data_00->g_traversable;
  local_1380 = &local_1458;
  local_1388 = &local_1468;
  local_1124 = 0;
  local_dcc = 0;
  local_de8 = 0;
  uStack_de4 = 0;
  uStack_de0 = 0;
  uStack_ddc = 0;
  local_e68 = 0;
  uStack_e60 = 0;
  local_1370 = &local_1438;
  local_f58 = 0xffffffffffffffff;
  uStack_f50 = 0xffffffff;
  pVStack_11c0 = (Vec3fa *)((ulong)pRStack_11a0 & 0xffffffff);
  local_e58 = 0xffffffffffffffff;
  uStack_e50 = 0xffffffff;
  local_fe8 = 0;
  uStack_fe0 = 0;
  local_1470 = local_2958 + 0x20;
  local_147c = 0;
  local_13c0 = &local_1498;
  local_13c4 = 0xffffffff;
  local_13c8 = 0xffffffff;
  local_13cc = 0xffffffff;
  local_13d0 = 0;
  local_106c = 0;
  local_1070 = 0xffffffff;
  local_1074 = 0xffffffff;
  local_1078 = 0xffffffff;
  local_1088 = 0xffffffffffffffff;
  uStack_1080 = 0xffffffff;
  local_1498 = 0xffffffffffffffff;
  uStack_1490 = 0xffffffff;
  local_12f8 = 0xffffffffffffffff;
  uStack_12f0 = 0xffffffff;
  local_1358 = &local_14b8;
  local_14b8 = 0xffffffffffffffff;
  uStack_14b0 = 0xffffffff;
  local_11e8 = local_2968;
  uStack_1180 = uStack_2960;
  local_1360 = &local_14c8;
  local_1368 = &local_14d8;
  local_1114 = 0;
  local_dec = 0;
  local_e08 = 0;
  uStack_e04 = 0;
  uStack_e00 = 0;
  uStack_dfc = 0;
  local_e88 = 0;
  uStack_e80 = 0;
  local_1350 = &local_14a8;
  local_f78 = 0xffffffffffffffff;
  uStack_f70 = 0xffffffff;
  piStack_11e0 = (int *)(uStack_2960 & 0xffffffff);
  local_e78 = 0xffffffffffffffff;
  uStack_e70 = 0xffffffff;
  local_1008 = 0;
  uStack_1000 = 0;
  local_2924 = 0xffffffff;
  local_13f0 = &local_2918;
  local_2904 = 0xffffffff;
  local_2900 = 0xffffffff;
  local_28fc = 0xffffffff;
  local_28f8 = 0xffffffff;
  local_25b0 = &local_29f8;
  local_29f8 = 0;
  local_29f0 = 0;
  local_29e8 = 0;
  local_29e0 = 0;
  local_29f4 = 0xe38e2;
  local_2600 = (float)local_2958._48_4_;
  local_25f8 = &local_2968;
  local_25f0 = data_00;
  local_25a8 = local_25e8;
  local_1478 = &local_2968;
  local_1408 = data_00;
  local_1400 = local_25e8;
  local_12c8 = local_13d8;
  local_12c0 = local_13c0;
  local_12a8 = local_1308;
  uStack_12a0 = uStack_1300;
  local_1290 = local_1378;
  local_1288 = local_12f8;
  uStack_1280 = uStack_12f0;
  local_1270 = local_1358;
  local_11d0 = local_1350;
  local_11b0 = local_1370;
  local_11a8 = local_11c8;
  local_1190 = local_1380;
  local_1188 = local_11e8;
  local_1170 = local_1360;
  local_1120 = local_1388;
  local_1110 = local_1368;
  local_10e8 = local_1370;
  local_10e0 = local_1350;
  local_ff8 = local_11e8;
  piStack_ff0 = piStack_11e0;
  local_fd8 = local_11c8;
  pVStack_fd0 = pVStack_11c0;
  local_f88 = local_11e8;
  uStack_f80 = uStack_1180;
  local_f68 = local_11c8;
  pRStack_f60 = pRStack_11a0;
  local_f28 = local_1358;
  local_f20 = local_1358;
  local_f18 = local_1378;
  local_f10 = local_1378;
  local_ee8 = local_1368;
  local_ee0 = local_1360;
  local_ed8 = local_1388;
  local_ed0 = local_1380;
  local_2958._16_8_ = local_11c8;
  local_2958._24_8_ = pVStack_11c0;
  local_2958._32_8_ = local_11e8;
  local_2958._40_8_ = piStack_11e0;
  local_14d8 = local_e88;
  uStack_14d0 = uStack_e80;
  local_14c8 = local_11e8;
  uStack_14c0 = uStack_1180;
  local_14a8 = local_11e8;
  piStack_14a0 = piStack_11e0;
  local_1468 = local_e68;
  uStack_1460 = uStack_e60;
  local_1458 = local_11c8;
  pRStack_1450 = pRStack_11a0;
  local_1438 = local_11c8;
  pVStack_1430 = pVStack_11c0;
  rtcTraversableIntersect1(local_28c8->g_traversable,local_25e8);
  local_25a0 = in_stack_00000010;
  *in_stack_00000010 = *in_stack_00000010 + 1;
  local_2500 = &local_2a08;
  local_2504 = 0;
  local_d98 = 0;
  local_da8 = 0;
  uStack_da4 = 0;
  uStack_da0 = 0;
  uStack_d9c = 0;
  local_2a08 = 0.0;
  fStack_2a04 = 0.0;
  uStack_2a00 = 0;
  if (local_2900 == 0xffffffff) goto LAB_0012fd56;
  local_24d8 = &local_2a18;
  local_24dc = 0x3f800000;
  local_24e0 = 0;
  local_24e4 = 0;
  local_1c5c = 0;
  local_1c60 = 0;
  local_1c64 = 0;
  local_1c68 = 0x3f800000;
  local_1c78 = 0x3f800000;
  uStack_1c70 = 0;
  local_2a18 = 0x3f800000;
  uStack_2a10 = 0;
  if (local_2900 != 0) {
    if (local_2900 - 1 < 2) {
LAB_0012ce53:
      interpolate_linear(local_2a28,local_28c8,local_2904,local_290c);
      local_2460 = &local_2a18;
      local_2468 = local_2a28;
    }
    else if (local_2900 - 3 < 3) {
      interpolate_bspline(data_00,local_2900,in_stack_ffffffffffffd3a0);
      local_2470 = &local_2a18;
      local_2478 = local_2a38;
    }
    else {
      if (local_2900 == 6) goto LAB_0012ce53;
      if (local_2900 - 7 < 3) {
        interpolate_catmull_rom(data_00,local_2900,in_stack_ffffffffffffd3a0);
        local_2480 = &local_2a18;
        local_2488 = local_2a48;
      }
    }
    local_2790 = &local_2a58;
    local_2794 = 0x3f000000;
    local_27a0 = &local_2a18;
    local_2540 = &local_27b8;
    local_2544 = 0x3f000000;
    local_d18 = 0x3f000000;
    local_d28 = 0x3f000000;
    uStack_d24 = 0x3f000000;
    uStack_d20 = 0x3f000000;
    uStack_d1c = 0x3f000000;
    local_27b8 = 0x3f0000003f000000;
    uStack_27b0 = 0x3f0000003f000000;
    local_1f10 = &local_2a58;
    local_1f18 = &local_27b8;
    local_1de8 = 0x3f0000003f000000;
    uStack_1de0 = 0x3f0000003f000000;
    local_1df8._0_4_ = (float)local_2a18;
    local_1df8._4_4_ = (float)((ulong)local_2a18 >> 0x20);
    uStack_1df0._0_4_ = (float)uStack_2a10;
    uStack_1df0._4_4_ = (float)((ulong)uStack_2a10 >> 0x20);
    local_1f08 = (float)local_1df8 * 0.5;
    fStack_1f04 = local_1df8._4_4_ * 0.5;
    fStack_1f00 = (float)uStack_1df0 * 0.5;
    fStack_1efc = uStack_1df0._4_4_ * 0.5;
    local_1ef8 = &local_2a58;
    local_2a58 = CONCAT44(fStack_1f04,local_1f08);
    uStack_2a50 = CONCAT44(fStack_1efc,fStack_1f00);
    local_2490 = &local_2a18;
    local_2498 = &local_2a58;
    local_1f20 = local_27a0;
    local_1df8 = local_2a18;
    uStack_1df0 = uStack_2a10;
    local_2a18 = local_2a58;
    uStack_2a10 = uStack_2a50;
  }
  local_2450 = &local_2918;
  local_26e8 = local_2a74;
  local_c = local_2910 * local_2910;
  local_18 = local_2914 * local_2914 + local_c;
  local_1b7c = local_2918 * local_2918 + local_18;
  local_1958._4_4_ = 0;
  local_1958._0_4_ = local_1b7c;
  local_1b98 = local_1958._0_8_;
  uStack_1b90 = 0;
  local_1908 = local_1958._0_8_;
  uStack_1900 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_1958._0_8_;
  local_1ba8 = rsqrtss(auVar3,auVar3);
  local_195c = 0x3fc00000;
  local_1978 = ZEXT416(0x3fc00000);
  local_1618 = local_1ba8._0_8_;
  uVar5 = local_1618;
  uStack_1610 = local_1ba8._8_8_;
  local_1618._0_4_ = local_1ba8._0_4_;
  local_1608 = (ulong)(uint)((float)local_1618 * 1.5);
  uStack_1600 = 0;
  local_197c = 0xbf000000;
  local_1998 = ZEXT416(0xbf000000);
  local_1638 = local_1998._0_8_;
  uStack_1630 = 0;
  local_1628 = (ulong)(uint)(local_1b7c * -0.5);
  uStack_1620 = 0;
  local_1658 = local_1ba8._0_8_;
  uStack_1650 = local_1ba8._8_8_;
  local_2454 = local_1b7c * -0.5 * (float)local_1618;
  local_1648 = (ulong)(uint)local_2454;
  uStack_1640 = 0;
  local_1678 = local_1ba8._0_8_;
  uStack_1670 = local_1ba8._8_8_;
  local_1668 = CONCAT44(local_1ba8._4_4_,(float)local_1618 * (float)local_1618);
  uStack_1660 = local_1ba8._8_8_;
  local_1698 = local_1668;
  uStack_1690 = local_1ba8._8_8_;
  local_2454 = local_2454 * (float)local_1618 * (float)local_1618;
  local_1688 = (ulong)(uint)local_2454;
  uStack_1680 = 0;
  local_1898 = local_1688;
  uStack_1890 = 0;
  local_2454 = (float)local_1618 * 1.5 + local_2454;
  local_1888 = (ulong)(uint)local_2454;
  uStack_1880 = 0;
  local_1bb8 = local_1888;
  uStack_1bb0 = 0;
  local_15c8 = local_1888;
  uStack_15c0 = 0;
  local_68 = &local_2454;
  local_1c48 = local_2918 * local_2454;
  local_38 = &local_6c;
  local_40 = &local_70;
  local_48 = &local_74;
  local_2a68.m128[1] = local_70;
  local_26e0 = &local_2a68;
  local_1c3c = 0;
  uStack_1c50 = (ulong)(uint)local_74;
  local_2890 = &local_2a98;
  local_27f8 = &local_2a18;
  local_27fc = 0x3f000000;
  local_2520 = &local_2818;
  local_2524 = 0x3f000000;
  local_d4c = 0x3f000000;
  local_d68 = 0x3f000000;
  uStack_d64 = 0x3f000000;
  uStack_d60 = 0x3f000000;
  uStack_d5c = 0x3f000000;
  local_2818 = 0x3f0000003f000000;
  uStack_2810 = 0x3f0000003f000000;
  local_1e38 = 0x3f0000003f000000;
  uStack_1e30 = 0x3f0000003f000000;
  local_1e28._0_4_ = (float)local_2a18;
  local_1e28._4_4_ = (float)((ulong)local_2a18 >> 0x20);
  uStack_1e20._0_4_ = (float)uStack_2a10;
  uStack_1e20._4_4_ = (float)((ulong)uStack_2a10 >> 0x20);
  local_1ea8 = (float)local_1e28 * 0.5;
  fStack_1ea4 = local_1e28._4_4_ * 0.5;
  fStack_1ea0 = (float)uStack_1e20 * 0.5;
  fStack_1e9c = uStack_1e20._4_4_ * 0.5;
  local_2238 = CONCAT44(fStack_1ea4,local_1ea8);
  uStack_2230 = CONCAT44(fStack_1e9c,fStack_1ea0);
  local_2880 = &local_2a88;
  local_2888 = &local_2a08;
  local_2228 = local_2a08;
  fStack_2224 = fStack_2a04;
  uStack_2220._0_4_ = (float)uStack_2a00;
  uStack_2220._4_4_ = (float)(uStack_2a00 >> 0x20);
  local_2158 = local_2a08 + local_1ea8;
  fStack_2154 = fStack_2a04 + fStack_1ea4;
  fStack_2150 = (float)uStack_2220 + fStack_1ea0;
  fStack_214c = uStack_2220._4_4_ + fStack_1e9c;
  uStack_2a80 = CONCAT44(fStack_214c,fStack_2150);
  local_2698 = &local_2ab8;
  local_24c4 = 0xbf800000;
  local_24c8 = 0xbf800000;
  local_24cc = 0xbf800000;
  local_1c7c = 0;
  local_1c80 = 0xbf800000;
  local_1c84 = 0xbf800000;
  local_1c88 = 0xbf800000;
  local_1c98 = 0xbf800000bf800000;
  uStack_1c90 = 0xbf800000;
  local_2ab8 = 0xbf800000bf800000;
  uStack_2ab0 = 0xbf800000;
  local_2690 = &local_2aa8;
  local_2060 = &local_2318;
  local_1d08 = 0xbf800000bf800000;
  uStack_1d00 = 0xbf800000;
  local_1d18 = 0xbf800000bf800000;
  uStack_1d10 = 0xbf800000;
  local_2058 = 0x3f800000;
  uStack_2054 = 0x3f800000;
  uStack_2050 = 0x3f800000;
  uStack_204c = 0;
  local_908 = 0x3f8000003f800000;
  uStack_900 = 0x3f800000;
  local_8f8 = &local_938;
  local_838 = &local_948;
  local_678 = 0x3f8000003f800000;
  uStack_670 = 0x3f8000003f800000;
  local_7e8 = &local_958;
  local_6d8 = 0x3f8000003f800000;
  uStack_6d0 = 0x3f8000003f800000;
  local_6e8 = &local_978;
  local_658 = 0x40000000;
  uStack_654 = 0x40000000;
  uStack_650 = 0x40000000;
  uStack_64c = 0x3f800000;
  local_6c8 = 0x4000000040000000;
  uStack_6c0 = 0x3f80000040000000;
  local_8f0 = &local_968;
  local_1afc = 0x40400000;
  uStack_6b4 = 0x40400000;
  uStack_6b0 = 0x40400000;
  uStack_6ac = 0x40000000;
  local_918 = 0x4040000040400000;
  uStack_910 = 0x4000000040400000;
  local_1a18 = ZEXT416(0x40400000);
  local_1b18 = 0x40400000;
  uStack_1b10 = 0;
  local_1928 = 0x40400000;
  uStack_1920 = 0;
  local_1b28 = rsqrtss(ZEXT816(0x40400000),ZEXT816(0x40400000));
  local_1a1c = 0x3fc00000;
  local_1a38 = ZEXT416(0x3fc00000);
  local_1758 = local_1b28._0_8_;
  uVar4 = local_1758;
  uStack_1750 = local_1b28._8_8_;
  local_1758._0_4_ = local_1b28._0_4_;
  local_1748 = (ulong)(uint)((float)local_1758 * 1.5);
  uStack_1740 = 0;
  local_1a3c = 0xbf000000;
  local_1a58 = ZEXT416(0xbf000000);
  local_1778 = local_1a58._0_8_;
  uStack_1770 = 0;
  local_1768 = 0xbfc00000;
  uStack_1760 = 0;
  local_1798 = local_1b28._0_8_;
  uStack_1790 = local_1b28._8_8_;
  local_1788 = (ulong)(uint)((float)local_1758 * -1.5);
  uStack_1780 = 0;
  local_17b8 = local_1b28._0_8_;
  uStack_17b0 = local_1b28._8_8_;
  local_17a8 = CONCAT44(local_1b28._4_4_,(float)local_1758 * (float)local_1758);
  uStack_17a0 = local_1b28._8_8_;
  local_17d8 = local_17a8;
  uStack_17d0 = local_1b28._8_8_;
  local_266c = (float)local_1758 * -1.5 * (float)local_1758 * (float)local_1758;
  local_17c8 = (ulong)(uint)local_266c;
  uStack_17c0 = 0;
  local_18d8 = local_17c8;
  uStack_18d0 = 0;
  local_266c = (float)local_1758 * 1.5 + local_266c;
  local_18c8 = (ulong)(uint)local_266c;
  uStack_18c0 = 0;
  local_1b38 = local_18c8;
  uStack_1b30 = 0;
  local_15e8 = local_18c8;
  uStack_15e0 = 0;
  local_2580 = &local_2688;
  local_1d78 = CONCAT44(local_266c,local_266c);
  uStack_1d70 = CONCAT44(local_266c,local_266c);
  local_1d68 = 0xbf800000bf800000;
  uStack_1d60 = 0xbf800000;
  local_1fc8 = local_266c * -1.0;
  fStack_1fc4 = local_266c * -1.0;
  fStack_1fc0 = local_266c * -1.0;
  fStack_1fbc = local_266c * 0.0;
  local_2418 = local_2958 + 0x20;
  local_2440 = &local_2b48;
  local_240c = (float)local_2958._48_4_;
  local_c48 = local_2428;
  local_bf4 = (float)local_2958._48_4_;
  local_bcc = (float)local_2958._48_4_;
  local_be8 = (float)local_2958._48_4_;
  fStack_be4 = (float)local_2958._48_4_;
  fStack_be0 = (float)local_2958._48_4_;
  fStack_bdc = (float)local_2958._48_4_;
  local_c38._0_4_ = (float)local_2958._32_8_;
  local_c38._4_4_ = SUB84(local_2958._32_8_,4);
  uStack_c30._0_4_ = (float)local_2958._40_8_;
  uStack_c30._4_4_ = SUB84(local_2958._40_8_,4);
  local_c18 = (float)local_2958._48_4_ * (float)local_c38;
  fStack_c14 = (float)local_2958._48_4_ * local_c38._4_4_;
  fStack_c10 = (float)local_2958._48_4_ * (float)uStack_c30;
  fStack_c0c = (float)local_2958._48_4_ * uStack_c30._4_4_;
  local_2298 = CONCAT44(fStack_c14,local_c18);
  uStack_2290 = CONCAT44(fStack_c0c,fStack_c10);
  local_2430 = &local_2b38;
  local_2438 = local_2958 + 0x10;
  local_2288._0_4_ = (float)local_2958._16_8_;
  local_2288._4_4_ = SUB84(local_2958._16_8_,4);
  uStack_2280._0_4_ = (float)local_2958._24_8_;
  uStack_2280._4_4_ = SUB84(local_2958._24_8_,4);
  local_c68 = (float)local_2288 + local_c18;
  fStack_c64 = local_2288._4_4_ + fStack_c14;
  fStack_c60 = (float)uStack_2280 + fStack_c10;
  fStack_c5c = uStack_2280._4_4_ + fStack_c0c;
  local_21d8 = CONCAT44(fStack_c64,local_c68);
  uStack_21d0 = CONCAT44(fStack_c5c,fStack_c60);
  local_b6c = 0x80000000;
  local_b4c = 0x80000000;
  local_b50 = 0x80000000;
  local_b54 = 0x80000000;
  local_b58 = 0x80000000;
  local_bc8 = 0x8000000080000000;
  uStack_bc0 = 0x8000000080000000;
  local_ba8 = -local_1fc8;
  fStack_ba4 = -fStack_1fc4;
  fStack_ba0 = -fStack_1fc0;
  fStack_b9c = -fStack_1fbc;
  local_2620 = &inf;
  local_27f0 = local_2890;
  local_2668 = local_2698;
  local_2660 = local_2690;
  local_2584 = local_266c;
  local_24c0 = local_2698;
  local_24a8 = local_2880;
  local_24a0 = local_2888;
  local_2448 = local_26e8;
  local_2408 = local_2440;
  local_23f0 = local_2430;
  local_23e8 = &local_2b28;
  local_23e0 = local_2690;
  local_23d8 = local_2b58;
  local_2308 = local_2698;
  local_2300 = local_2698;
  local_2288 = (RTCScene)local_2958._16_8_;
  uStack_2280 = (Vec3fa *)local_2958._24_8_;
  uStack_2220 = uStack_2a00;
  local_21c0 = &local_2b28;
  local_2140 = local_2880;
  local_2070 = local_2698;
  local_2068 = local_2698;
  local_2048 = local_2060;
  local_1fe0 = local_2580;
  local_1fd8 = local_2698;
  local_1fd0 = local_2690;
  local_1fb8 = local_2690;
  local_1ec0 = local_2520;
  local_1eb8 = local_27f8;
  local_1eb0 = local_2890;
  local_1e98 = local_2890;
  local_1e28 = local_2a18;
  uStack_1e20 = uStack_2a10;
  local_19fc = local_1afc;
  local_1958 = ZEXT416((uint)local_1b7c);
  local_193c = local_1b7c;
  local_1758 = uVar4;
  local_1618 = uVar5;
  local_ca8 = local_266c;
  fStack_ca4 = local_266c;
  fStack_ca0 = local_266c;
  fStack_c9c = local_266c;
  local_c8c = local_266c;
  local_c58 = local_2430;
  local_c50 = local_2418;
  local_c40 = local_2440;
  local_c38 = (Vec3fa *)local_2958._32_8_;
  uStack_c30 = (int *)local_2958._40_8_;
  local_c00 = local_2440;
  local_bf0 = local_c48;
  local_bb8 = local_2690;
  local_bb0 = local_2b58;
  local_b90 = local_2b58;
  local_b88 = local_bc8;
  uStack_b80 = uStack_bc0;
  local_b68 = local_bc8;
  uStack_b60 = uStack_bc0;
  local_b48 = local_bc8;
  uStack_b40 = uStack_bc0;
  local_920 = local_2060;
  local_840 = local_8f8;
  local_7f0 = local_8f8;
  local_6f0 = local_7e8;
  local_6e0 = local_8f0;
  local_6b8 = local_1afc;
  local_6a8 = local_8f0;
  local_6a0 = local_7e8;
  local_698 = local_6e8;
  local_690 = local_838;
  local_688 = local_8f8;
  local_680 = local_6e8;
  local_668 = local_908;
  uStack_660 = uStack_900;
  local_648 = local_6e8;
  local_640 = local_838;
  local_638 = local_8f8;
  local_328 = local_8f8;
  local_320 = local_838;
  local_318 = uStack_2054;
  uStack_314 = uStack_2054;
  uStack_310 = uStack_2054;
  uStack_30c = uStack_2054;
  local_308 = local_678;
  uStack_300 = uStack_670;
  local_2f8 = local_838;
  local_2f0 = local_8f8;
  local_298 = local_908;
  uStack_290 = uStack_900;
  local_168 = local_8f8;
  local_160 = local_7e8;
  local_158 = uStack_2050;
  uStack_154 = uStack_2050;
  uStack_150 = uStack_2050;
  uStack_14c = uStack_2050;
  local_148 = local_6d8;
  uStack_140 = uStack_6d0;
  local_138 = local_7e8;
  local_130 = local_8f8;
  local_128 = local_908;
  uStack_120 = uStack_900;
  local_74 = local_2910 * local_2454;
  local_70 = local_2914 * local_2454;
  local_6c = local_1c48;
  local_60 = local_2450;
  local_58 = local_26e8;
  local_50 = local_2450;
  local_30 = local_26e8;
  local_28 = local_2450;
  local_20 = local_2450;
  local_2b48 = local_2298;
  uStack_2b40 = uStack_2290;
  local_2b38 = local_21d8;
  uStack_2b30 = uStack_21d0;
  local_2b28 = local_21d8;
  uStack_2b20 = uStack_21d0;
  local_2a98 = local_2238;
  uStack_2a90 = uStack_2230;
  local_2a74[0] = local_1c48;
  local_2a68._8_8_ = uStack_1c50;
  uStack_2a00 = uStack_2a80;
  local_2688 = local_1d78;
  uStack_2680 = uStack_1d70;
  local_2318 = local_908;
  uStack_2310 = uStack_900;
  local_978 = local_6c8;
  uStack_970 = uStack_6c0;
  local_968 = local_918;
  uStack_960 = uStack_910;
  local_958 = local_6d8;
  uStack_950 = uStack_6d0;
  local_948 = local_678;
  uStack_940 = uStack_670;
  local_938 = local_908;
  uStack_930 = uStack_900;
  local_2aa8 = local_1fc8;
  fStack_2aa4 = fStack_1fc4;
  local_b38 = local_1fc8;
  fStack_b34 = fStack_1fc4;
  fStack_2aa0 = fStack_1fc0;
  fStack_2a9c = fStack_1fbc;
  fStack_b30 = fStack_1fc0;
  fStack_b2c = fStack_1fbc;
  local_2a68.m128[0] = local_1c48;
  local_1c58 = local_1c48;
  local_2a08 = local_2158;
  fStack_2a04 = fStack_2154;
  local_2a88 = local_2158;
  fStack_2a84 = fStack_2154;
  local_2af8 = std::numeric_limits<float>::infinity();
  local_25b8 = &local_2b18;
  local_25cc = 0x3a83126f;
  local_25d4 = 0;
  local_25d8 = 0xffffffff;
  local_25dc = 0xffffffff;
  local_25e0 = 0xffffffff;
  local_14ec = 0x3a83126f;
  local_13a8 = &local_1508;
  local_13ac = 0xffffffff;
  local_13b0 = 0xffffffff;
  local_13b4 = 0xffffffff;
  local_13b8 = 0;
  local_108c = 0;
  local_1090 = 0xffffffff;
  local_1094 = 0xffffffff;
  local_1098 = 0xffffffff;
  local_10a8 = 0xffffffffffffffff;
  uStack_10a0 = 0xffffffff;
  local_1508 = 0xffffffffffffffff;
  uStack_1500 = 0xffffffff;
  local_12e8 = 0xffffffffffffffff;
  uStack_12e0 = 0xffffffff;
  local_1338 = &local_1528;
  local_1528 = 0xffffffffffffffff;
  uStack_1520 = 0xffffffff;
  local_1208 = local_2b28;
  uStack_1160 = uStack_2b20;
  local_1340 = &local_1538;
  local_1348 = &local_1548;
  local_1104 = 0x3a83126f;
  local_e0c = 0x3a83126f;
  local_e28 = 0x3a83126f;
  uStack_e24 = 0x3a83126f;
  uStack_e20 = 0x3a83126f;
  uStack_e1c = 0x3a83126f;
  local_ea8 = 0x3a83126f3a83126f;
  uStack_ea0 = 0x3a83126f3a83126f;
  local_1330 = &local_1518;
  local_f98 = 0xffffffffffffffff;
  uStack_f90 = 0xffffffff;
  uStack_1010 = uStack_2b20 & 0xffffffff;
  local_e98 = 0xffffffffffffffff;
  uStack_e90 = 0xffffffff;
  local_1028 = 0;
  uStack_1020 = 0x3a83126f00000000;
  uStack_1200 = uStack_1010 | 0x3a83126f00000000;
  local_1550 = local_2b08;
  local_155c = 0;
  local_1390 = &local_1578;
  local_1394 = 0xffffffff;
  local_1398 = 0xffffffff;
  local_139c = 0xffffffff;
  local_13a0 = 0;
  local_10ac = 0;
  local_10b0 = 0xffffffff;
  local_10b4 = 0xffffffff;
  local_10b8 = 0xffffffff;
  local_10c8 = 0xffffffffffffffff;
  uStack_10c0 = 0xffffffff;
  local_1578 = 0xffffffffffffffff;
  uStack_1570 = 0xffffffff;
  local_12d8 = 0xffffffffffffffff;
  uStack_12d0 = 0xffffffff;
  local_1318 = &local_1598;
  local_1598 = 0xffffffffffffffff;
  uStack_1590 = 0xffffffff;
  local_1320 = local_15a8;
  local_1328 = &local_15b8;
  local_10f4 = 0;
  local_e2c = 0;
  local_e48 = 0;
  uStack_e44 = 0;
  uStack_e40 = 0;
  uStack_e3c = 0;
  local_ec8 = 0;
  uStack_ec0 = 0;
  local_1310 = local_1588;
  local_fb8 = 0xffffffffffffffff;
  uStack_fb0 = 0xffffffff;
  uStack_1220 = uStack_2b50 & 0xffffffff;
  local_eb8 = 0xffffffffffffffff;
  uStack_eb0 = 0xffffffff;
  local_1048 = 0;
  uStack_1044 = 0;
  uStack_1040 = 0;
  uStack_103c = 0;
  local_1210 = local_1588;
  local_10d0 = local_1588;
  local_2af4 = 0xffffffff;
  local_13f8 = auStack_2ae8;
  local_2ad4 = 0xffffffff;
  local_2ad0 = 0xffffffff;
  local_2acc = 0xffffffff;
  local_2ac8 = 0xffffffff;
  local_23d0 = &local_2b78;
  local_2b78 = 0;
  local_2b70 = 0;
  local_2b68 = 0;
  local_2b60 = 0;
  local_2b74 = 0xe38e2;
  local_23c8 = &local_2b18;
  local_25d0 = local_2af8;
  local_25c8 = local_2b58;
  local_25c0 = &local_2b28;
  local_1558 = local_2b58;
  local_14e8 = &local_2b28;
  local_14e0 = local_25b8;
  local_12b8 = local_13a8;
  local_12b0 = local_1390;
  local_1268 = local_12e8;
  uStack_1260 = uStack_12e0;
  local_1250 = local_1338;
  local_1248 = local_12d8;
  uStack_1240 = uStack_12d0;
  local_1230 = local_1318;
  local_11f0 = local_1330;
  local_1168 = local_1208;
  local_1150 = local_1340;
  local_1130 = local_1320;
  local_1100 = local_1348;
  local_10f0 = local_1328;
  local_10d8 = local_1330;
  uStack_1030 = uStack_1220;
  local_1018 = local_1208;
  local_fa8 = local_1208;
  uStack_fa0 = uStack_1160;
  local_f48 = local_1318;
  local_f40 = local_1318;
  local_f38 = local_1338;
  local_f30 = local_1338;
  local_f08 = local_1328;
  local_f00 = local_1320;
  local_ef8 = local_1348;
  local_ef0 = local_1340;
  local_2b18 = local_1208;
  uStack_2b10 = uStack_1200;
  uStack_2b00 = uStack_1220;
  local_15b8 = local_ec8;
  uStack_15b0 = uStack_ec0;
  uStack_1580 = uStack_1220;
  local_1548 = local_ea8;
  uStack_1540 = uStack_ea0;
  local_1538 = local_1208;
  uStack_1530 = uStack_1160;
  local_1518 = local_1208;
  uStack_1510 = uStack_1200;
  rtcTraversableOccluded1(local_28c8->g_traversable,local_23c8,&local_2b78);
  local_23c0 = in_stack_00000010;
  *in_stack_00000010 = *in_stack_00000010 + 1;
  if (0.0 <= local_2af8) {
    local_2400 = local_2958 + 0x20;
    local_23f8 = &local_2ba8;
    local_21b8 = (Vec3fa *)local_2958._32_8_;
    piStack_21b0 = (int *)local_2958._40_8_;
    local_2ba8._0_8_ = local_2958._32_8_;
    local_2ba8._8_8_ = local_2958._40_8_;
    local_21a0 = local_23f8;
    reflect(local_2b98,(Vec3fa *)&local_23f8->field_1,(Vec3fa *)&local_2a68.field_1);
    local_26d0 = &local_2b88;
    local_2090 = &local_22f8;
    local_1ce8 = (float)local_2b98._0_8_;
    fStack_1ce4 = SUB84(local_2b98._0_8_,4);
    fStack_1ce0 = (float)local_2b98._8_8_;
    fStack_1cdc = SUB84(local_2b98._8_8_,4);
    local_2088 = local_1ce8 * local_1ce8;
    fStack_2084 = fStack_1ce4 * fStack_1ce4;
    fStack_2080 = fStack_1ce0 * fStack_1ce0;
    fStack_207c = fStack_1cdc * fStack_1cdc;
    local_998 = CONCAT44(fStack_2084,local_2088);
    uStack_990 = CONCAT44(fStack_207c,fStack_2080);
    local_988 = &local_9c8;
    local_828 = &local_9d8;
    local_5b8 = CONCAT44(fStack_2084,fStack_2084);
    uStack_5b0 = CONCAT44(fStack_2084,fStack_2084);
    local_7d8 = &local_9e8;
    local_618 = CONCAT44(fStack_2080,fStack_2080);
    uStack_610 = CONCAT44(fStack_2080,fStack_2080);
    local_628 = &local_a08;
    local_598 = local_2088 + fStack_2084;
    fStack_594 = fStack_2084 + fStack_2084;
    fStack_590 = fStack_2080 + fStack_2084;
    fStack_58c = fStack_207c + fStack_2084;
    local_608 = CONCAT44(fStack_594,local_598);
    uStack_600 = CONCAT44(fStack_58c,fStack_590);
    local_980 = &local_9f8;
    local_1abc = local_598 + fStack_2080;
    fStack_5f4 = fStack_594 + fStack_2080;
    fStack_5f0 = fStack_590 + fStack_2080;
    fStack_5ec = fStack_58c + fStack_2080;
    local_9a8 = CONCAT44(fStack_5f4,local_1abc);
    uStack_9a0 = CONCAT44(fStack_5ec,fStack_5f0);
    local_1a78 = ZEXT416((uint)local_1abc);
    local_1ad8 = CONCAT44(0,local_1abc);
    uStack_1ad0 = 0;
    uStack_1930 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_1ad8;
    local_1ae8 = rsqrtss(auVar1,auVar1);
    local_1a7c = 0x3fc00000;
    local_1a98 = ZEXT416(0x3fc00000);
    local_17f8 = local_1ae8._0_8_;
    uVar4 = local_17f8;
    uStack_17f0 = local_1ae8._8_8_;
    local_17f8._0_4_ = local_1ae8._0_4_;
    local_17e8 = (ulong)(uint)((float)local_17f8 * 1.5);
    uStack_17e0 = 0;
    local_1a9c = 0xbf000000;
    local_1ab8 = ZEXT416(0xbf000000);
    local_1818 = local_1ab8._0_8_;
    uStack_1810 = 0;
    local_1808 = (ulong)(uint)(local_1abc * -0.5);
    uStack_1800 = 0;
    local_1838 = local_1ae8._0_8_;
    uStack_1830 = local_1ae8._8_8_;
    local_26ac = local_1abc * -0.5 * (float)local_17f8;
    local_1828 = (ulong)(uint)local_26ac;
    uStack_1820 = 0;
    local_1858 = local_1ae8._0_8_;
    uStack_1850 = local_1ae8._8_8_;
    local_1848 = CONCAT44(local_1ae8._4_4_,(float)local_17f8 * (float)local_17f8);
    uStack_1840 = local_1ae8._8_8_;
    local_1878 = local_1848;
    uStack_1870 = local_1ae8._8_8_;
    local_26ac = local_26ac * (float)local_17f8 * (float)local_17f8;
    local_1868 = (ulong)(uint)local_26ac;
    uStack_1860 = 0;
    local_18f8 = local_1868;
    uStack_18f0 = 0;
    local_26ac = (float)local_17f8 * 1.5 + local_26ac;
    local_18e8 = (ulong)(uint)local_26ac;
    uStack_18e0 = 0;
    local_1af8 = local_18e8;
    uStack_1af0 = 0;
    local_15f8 = local_18e8;
    uStack_15f0 = 0;
    local_2570 = &local_26c8;
    local_1d98 = CONCAT44(local_26ac,local_26ac);
    uStack_1d90 = CONCAT44(local_26ac,local_26ac);
    local_1f98 = local_1ce8 * local_26ac;
    fStack_1f94 = fStack_1ce4 * local_26ac;
    fStack_1f90 = fStack_1ce0 * local_26ac;
    fStack_1f8c = fStack_1cdc * local_26ac;
    local_1ca8 = CONCAT44(fStack_1f94,local_1f98);
    uStack_1ca0 = CONCAT44(fStack_1f8c,fStack_1f90);
    local_22a8 = &local_2aa8;
    local_20f0 = &local_22b8;
    local_1cb8 = local_2aa8;
    fStack_1cb4 = fStack_2aa4;
    fStack_1cb0 = fStack_2aa0;
    fStack_1cac = fStack_2a9c;
    local_20e8 = local_1f98 * local_2aa8;
    fStack_20e4 = fStack_1f94 * fStack_2aa4;
    fStack_20e0 = fStack_1f90 * fStack_2aa0;
    fStack_20dc = fStack_1f8c * fStack_2a9c;
    local_ab8 = CONCAT44(fStack_20e4,local_20e8);
    uStack_ab0 = CONCAT44(fStack_20dc,fStack_20e0);
    local_aa8 = &local_ae8;
    local_808 = &local_af8;
    local_438 = CONCAT44(fStack_20e4,fStack_20e4);
    uStack_430 = CONCAT44(fStack_20e4,fStack_20e4);
    local_7b8 = &local_b08;
    local_498 = CONCAT44(fStack_20e0,fStack_20e0);
    uStack_490 = CONCAT44(fStack_20e0,fStack_20e0);
    local_4a8 = &local_b28;
    local_418 = local_20e8 + fStack_20e4;
    fStack_414 = fStack_20e4 + fStack_20e4;
    fStack_410 = fStack_20e0 + fStack_20e4;
    fStack_40c = fStack_20dc + fStack_20e4;
    local_488 = CONCAT44(fStack_414,local_418);
    uStack_480 = CONCAT44(fStack_40c,fStack_410);
    local_aa0 = &local_b18;
    local_2bb0[0] = local_418 + fStack_20e0;
    fStack_474 = fStack_414 + fStack_20e0;
    fStack_470 = fStack_410 + fStack_20e0;
    fStack_46c = fStack_40c + fStack_20e0;
    local_ac8 = CONCAT44(fStack_474,local_2bb0[0]);
    uStack_ac0 = CONCAT44(fStack_46c,fStack_470);
    local_2bb4 = 0;
    local_2bb8 = 0x3f800000;
    local_2340 = local_2bb0;
    local_2348 = &local_2bb4;
    local_2350 = &local_2bb8;
    local_9c = 1.0;
    local_2c84 = local_9c;
    if (local_2bb0[0] < 1.0) {
      local_2c84 = local_2bb0[0];
    }
    local_c4 = 0.0;
    local_c0 = local_2c84;
    local_2c88 = local_c4;
    if (0.0 <= local_2c84) {
      local_2c88 = local_2c84;
    }
    local_23b4 = local_2c88;
    local_23b8 = 0x41200000;
    local_26d8 = local_2b98;
    local_26a8 = local_2b98;
    local_26a0 = local_26d0;
    local_2574 = local_26ac;
    local_22e8 = local_2b98;
    local_22e0 = local_2b98;
    local_22a0 = local_26d0;
    local_2100 = local_22a8;
    local_20f8 = local_26d0;
    local_20d8 = local_20f0;
    local_20a0 = local_2b98;
    local_2098 = local_2b98;
    local_2078 = local_2090;
    local_1fb0 = local_2570;
    local_1fa8 = local_2b98;
    local_1fa0 = local_26d0;
    local_1f88 = local_26d0;
    local_1a5c = local_1abc;
    local_1938 = local_1ad8;
    local_17f8 = uVar4;
    local_cc8 = local_26ac;
    fStack_cc4 = local_26ac;
    fStack_cc0 = local_26ac;
    fStack_cbc = local_26ac;
    local_cac = local_26ac;
    local_ad0 = local_20f0;
    local_9b0 = local_2090;
    local_830 = local_988;
    local_810 = local_aa8;
    local_7e0 = local_988;
    local_7c0 = local_aa8;
    local_630 = local_7d8;
    local_620 = local_980;
    local_5f8 = local_1abc;
    local_5e8 = local_980;
    local_5e0 = local_7d8;
    local_5d8 = local_628;
    local_5d0 = local_828;
    local_5c8 = local_988;
    local_5c0 = local_628;
    local_5a8 = local_998;
    uStack_5a0 = uStack_990;
    local_588 = local_628;
    local_580 = local_828;
    local_578 = local_988;
    local_4b0 = local_7b8;
    local_4a0 = local_aa0;
    local_478 = local_2bb0[0];
    local_468 = local_aa0;
    local_460 = local_7b8;
    local_458 = local_4a8;
    local_450 = local_808;
    local_448 = local_aa8;
    local_440 = local_4a8;
    local_428 = local_ab8;
    uStack_420 = uStack_ab0;
    local_400 = local_4a8;
    local_3f8 = local_808;
    local_3f0 = local_aa8;
    local_3e8 = local_aa8;
    local_3e0 = local_808;
    local_3d8 = fStack_20e4;
    fStack_3d4 = fStack_20e4;
    fStack_3d0 = fStack_20e4;
    fStack_3cc = fStack_20e4;
    local_3c8 = local_438;
    uStack_3c0 = uStack_430;
    local_3b8 = local_808;
    local_3b0 = local_aa8;
    local_368 = local_988;
    local_360 = local_828;
    local_358 = fStack_2084;
    fStack_354 = fStack_2084;
    fStack_350 = fStack_2084;
    fStack_34c = fStack_2084;
    local_348 = local_5b8;
    uStack_340 = uStack_5b0;
    local_338 = local_828;
    local_330 = local_988;
    local_288 = local_998;
    uStack_280 = uStack_990;
    local_268 = local_ab8;
    uStack_260 = uStack_ab0;
    local_258 = local_aa8;
    local_250 = local_7b8;
    local_248 = fStack_20e0;
    fStack_244 = fStack_20e0;
    fStack_240 = fStack_20e0;
    fStack_23c = fStack_20e0;
    local_238 = local_498;
    uStack_230 = uStack_490;
    local_228 = local_7b8;
    local_220 = local_aa8;
    local_218 = local_ab8;
    uStack_210 = uStack_ab0;
    local_1b8 = local_988;
    local_1b0 = local_7d8;
    local_1a8 = fStack_2080;
    fStack_1a4 = fStack_2080;
    fStack_1a0 = fStack_2080;
    fStack_19c = fStack_2080;
    local_198 = local_618;
    uStack_190 = uStack_610;
    local_188 = local_7d8;
    local_180 = local_988;
    local_178 = local_998;
    uStack_170 = uStack_990;
    local_98 = local_2bb0[0];
    local_2b88 = local_1ca8;
    uStack_2b80 = uStack_1ca0;
    local_26c8 = local_1d98;
    uStack_26c0 = uStack_1d90;
    local_22f8 = local_998;
    uStack_22f0 = uStack_990;
    local_22b8 = local_ab8;
    uStack_22b0 = uStack_ab0;
    local_b28 = local_488;
    uStack_b20 = uStack_480;
    local_b18 = local_ac8;
    uStack_b10 = uStack_ac0;
    local_b08 = local_498;
    uStack_b00 = uStack_490;
    local_af8 = local_438;
    uStack_af0 = uStack_430;
    local_ae8 = local_ab8;
    uStack_ae0 = uStack_ab0;
    local_a08 = local_608;
    uStack_a00 = uStack_600;
    local_9f8 = local_9a8;
    uStack_9f0 = uStack_9a0;
    local_9e8 = local_618;
    uStack_9e0 = uStack_610;
    local_9d8 = local_5b8;
    uStack_9d0 = uStack_5b0;
    local_9c8 = local_998;
    uStack_9c0 = uStack_990;
    powf(local_2c88,10.0);
    fStack_1cd0 = (float)local_2a68._8_8_;
    fVar6 = -(local_2aa8 * local_2a68.m128[0] + fStack_2aa4 * local_2a68.m128[1] +
             fStack_2aa0 * fStack_1cd0);
    local_2c8c = 1.0;
    if (fVar6 < 1.0) {
      local_2c8c = fVar6;
    }
    local_2c90 = 0.0;
    if (0.0 <= local_2c8c) {
      local_2c90 = local_2c8c;
    }
    local_1e48 = (float)local_2a18;
    fStack_1e44 = (float)((ulong)local_2a18 >> 0x20);
    fStack_1e40 = (float)uStack_2a10;
    fStack_2200 = (float)uStack_2a00;
    local_1e18 = (float)local_2c18;
    fStack_1e14 = (float)((ulong)local_2c18 >> 0x20);
    local_2a08 = local_2a08 + local_1e48 * local_2c90 + local_1e18 * 0.5;
    fStack_2a04 = fStack_2a04 + fStack_1e44 * local_2c90 + fStack_1e14 * 0.5;
    uStack_2a00 = (ulong)(uint)(fStack_2200 + fStack_1e40 * local_2c90 + fStack_2c10 * 0.5);
  }
LAB_0012fd56:
  local_2c94 = 1.0;
  if (local_2a08 < 1.0) {
    local_2c94 = local_2a08;
  }
  local_2c98 = 0.0;
  if (0.0 <= local_2c94) {
    local_2c98 = local_2c94;
  }
  local_2c9c = 1.0;
  if (fStack_2a04 < 1.0) {
    local_2c9c = fStack_2a04;
  }
  local_2ca0 = 0.0;
  if (0.0 <= local_2c9c) {
    local_2ca0 = local_2c9c;
  }
  local_2ca4 = 1.0;
  if ((float)uStack_2a00 < 1.0) {
    local_2ca4 = (float)uStack_2a00;
  }
  local_2ca8 = 0.0;
  if (0.0 <= local_2ca4) {
    local_2ca8 = local_2ca4;
  }
  *(int *)(local_28d8 + (ulong)(uint)(local_28d0 * local_28dc + local_28cc) * 4) =
       (int)(long)(local_2ca8 * 255.0) * 0x10000 + (int)(long)(local_2ca0 * 255.0) * 0x100 +
       (int)(long)(local_2c98 * 255.0);
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y, 
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera, RayStats& stats)
{
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  /* intersect ray with scene */
  RTCIntersectArguments iargs;
  rtcInitIntersectArguments(&iargs);
  iargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  rtcTraversableIntersect1(data.g_traversable,RTCRayHit_(ray),&iargs);
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    /* interpolate diffuse color */
    Vec3fa diffuse = Vec3fa(1.0f,0.0f,0.0f);
    if (ray.geomID > 0)
    {
      switch (ray.geomID) {
      case 1: case 2: case 6: diffuse = interpolate_linear(data,ray.primID,ray.u); break;
      case 3: case 4: case 5: diffuse = interpolate_bspline(data,ray.primID,ray.u); break;
      case 7: case 8: case 9: diffuse = interpolate_catmull_rom(data,ray.primID,ray.u); break;
      }

      diffuse = 0.5f*diffuse;
    }

    /* calculate smooth shading normal */
    Vec3fa Ng = normalize(ray.Ng);
    color = color + diffuse*0.5f;
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));

    /* initialize shadow ray */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(lightDir), 0.001f, inf, 0.0f);

    /* trace shadow ray */
    RTCOccludedArguments sargs;
    rtcInitOccludedArguments(&sargs);
    sargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
    rtcTraversableOccluded1(data.g_traversable,RTCRay_(shadow),&sargs);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f) {
      Vec3fa r = normalize(reflect(ray.dir,Ng));
      float s = pow(clamp(dot(r,lightDir),0.0f,1.0f),10.0f);
      float d = clamp(-dot(lightDir,Ng),0.0f,1.0f);
      color = color + diffuse*d + 0.5f*Vec3fa(s);
    }
  }

  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}